

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O0

TSpirvRequirement * __thiscall
glslang::TParseContext::makeSpirvRequirement
          (TParseContext *this,TSourceLoc *loc,TString *name,TIntermAggregate *extensions,
          TIntermAggregate *capabilities)

{
  TIntermNode *pTVar1;
  bool bVar2;
  int iVar3;
  TSpirvRequirement *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TString *this_01;
  undefined4 extraout_var_02;
  reference ppTVar4;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  TConstUnionArray *pTVar5;
  TConstUnion *pTVar6;
  char *pcVar7;
  value_type *__x;
  int local_8c;
  TIntermNode *local_88;
  TIntermNode *capability;
  const_iterator __end3;
  const_iterator __begin3;
  TIntermSequence *__range3;
  TIntermNode *extension;
  const_iterator __end2;
  const_iterator __begin2;
  TIntermSequence *__range2;
  TSpirvRequirement *spirvReq;
  TIntermAggregate *capabilities_local;
  TIntermAggregate *extensions_local;
  TString *name_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  this_00 = (TSpirvRequirement *)
            TSpirvRequirement::operator_new((TSpirvRequirement *)0x70,(size_t)loc);
  TSpirvRequirement::TSpirvRequirement(this_00);
  bVar2 = std::operator==(name,"extensions");
  if (bVar2) {
    if (extensions == (TIntermAggregate *)0x0) {
      __assert_fail("extensions",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                    ,0x41,
                    "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                   );
    }
    iVar3 = (*(extensions->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x33])();
    __end2 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                       ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                        CONCAT44(extraout_var,iVar3));
    extension = (TIntermNode *)
                std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                          ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                           CONCAT44(extraout_var,iVar3));
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                       *)&extension), bVar2) {
      ppTVar4 = __gnu_cxx::
                __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&__end2);
      pTVar1 = *ppTVar4;
      iVar3 = (*pTVar1->_vptr_TIntermNode[5])();
      if (CONCAT44(extraout_var_00,iVar3) == 0) {
        __assert_fail("extension->getAsConstantUnion()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                      ,0x43,
                      "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                     );
      }
      iVar3 = (*pTVar1->_vptr_TIntermNode[5])();
      pTVar5 = TIntermConstantUnion::getConstArray
                         ((TIntermConstantUnion *)CONCAT44(extraout_var_01,iVar3));
      pTVar6 = TConstUnionArray::operator[](pTVar5,0);
      this_01 = TConstUnion::getSConst_abi_cxx11_(pTVar6);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
      ::insert((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_bool>
                *)this_00,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                *)this_01,__x);
      __gnu_cxx::
      __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    bVar2 = std::operator==(name,"capabilities");
    if (bVar2) {
      if (capabilities == (TIntermAggregate *)0x0) {
        __assert_fail("capabilities",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                      ,0x47,
                      "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                     );
      }
      iVar3 = (*(capabilities->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x33])();
      __end3 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin
                         ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                          CONCAT44(extraout_var_02,iVar3));
      capability = (TIntermNode *)
                   std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end
                             ((vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
                              CONCAT44(extraout_var_02,iVar3));
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                         *)&capability), bVar2) {
        ppTVar4 = __gnu_cxx::
                  __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                  ::operator*(&__end3);
        local_88 = *ppTVar4;
        iVar3 = (*local_88->_vptr_TIntermNode[5])();
        if (CONCAT44(extraout_var_03,iVar3) == 0) {
          __assert_fail("capability->getAsConstantUnion()",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                        ,0x49,
                        "TSpirvRequirement *glslang::TParseContext::makeSpirvRequirement(const TSourceLoc &, const TString &, const TIntermAggregate *, const TIntermAggregate *)"
                       );
        }
        iVar3 = (*local_88->_vptr_TIntermNode[5])();
        pTVar5 = TIntermConstantUnion::getConstArray
                           ((TIntermConstantUnion *)CONCAT44(extraout_var_04,iVar3));
        pTVar6 = TConstUnionArray::operator[](pTVar5,0);
        local_8c = TConstUnion::getIConst(pTVar6);
        std::set<int,_std::less<int>,_glslang::pool_allocator<int>_>::insert
                  (&(this_00->capabilities).
                    super_set<int,_std::less<int>,_glslang::pool_allocator<int>_>,&local_8c);
        __gnu_cxx::
        __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
        ::operator++(&__end3);
      }
    }
    else {
      pcVar7 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (name);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"unknown SPIR-V requirement",pcVar7,"");
    }
  }
  return this_00;
}

Assistant:

TSpirvRequirement* TParseContext::makeSpirvRequirement(const TSourceLoc& loc, const TString& name,
                                                       const TIntermAggregate* extensions,
                                                       const TIntermAggregate* capabilities)
{
    TSpirvRequirement* spirvReq = new TSpirvRequirement;

    if (name == "extensions") {
        assert(extensions);
        for (auto extension : extensions->getSequence()) {
            assert(extension->getAsConstantUnion());
            spirvReq->extensions.insert(*extension->getAsConstantUnion()->getConstArray()[0].getSConst());
        }
    } else if (name == "capabilities") {
        assert(capabilities);
        for (auto capability : capabilities->getSequence()) {
            assert(capability->getAsConstantUnion());
            spirvReq->capabilities.insert(capability->getAsConstantUnion()->getConstArray()[0].getIConst());
        }
    } else
        error(loc, "unknown SPIR-V requirement", name.c_str(), "");

    return spirvReq;
}